

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred_ssse3_intr.c
# Opt level: O0

void ihevc_weighted_pred_uni_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD32 wgt0,
               WORD32 off0,WORD32 shift,WORD32 lvl_shift,WORD32 ht,WORD32 wd)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [12];
  int iVar40;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  short in_R8W;
  int in_R9D;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  char cStack0000000000000008;
  WORD32 dst3;
  WORD32 dst2;
  WORD32 dst1;
  WORD32 dst0;
  __m128i res_temp7_4x32b;
  __m128i res_temp6_4x32b;
  __m128i res_temp5_4x32b;
  __m128i res_temp4_4x32b;
  __m128i res_temp3_4x32b;
  __m128i res_temp2_4x32b;
  __m128i res_temp1_4x32b;
  __m128i res_temp0_4x32b;
  __m128i off0_4x32b;
  __m128i wgt0_8x16b;
  __m128i lvl_shift_4x32b;
  __m128i const_temp_4x32b;
  __m128i src_temp3_8x16b;
  __m128i src_temp2_8x16b;
  __m128i src_temp1_8x16b;
  __m128i src_temp0_8x16b;
  WORD32 temp;
  WORD32 col;
  WORD32 row;
  undefined2 uStack_d14;
  undefined2 uStack_d12;
  undefined2 uStack_d0c;
  undefined2 uStack_d0a;
  undefined2 uStack_d04;
  undefined2 uStack_d02;
  undefined2 uStack_cfc;
  undefined2 uStack_cfa;
  undefined2 uStack_cf4;
  undefined2 uStack_cf2;
  undefined2 uStack_cec;
  undefined2 uStack_cea;
  undefined2 uStack_ce4;
  undefined2 uStack_ce2;
  undefined2 uStack_cdc;
  undefined2 uStack_cda;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined4 uStack_c70;
  short sStack_c6c;
  undefined2 uStack_c6a;
  int local_c08;
  int local_c04;
  undefined8 *local_bf0;
  undefined1 (*local_be8) [16];
  short local_bc8;
  short sStack_bc6;
  short sStack_bc4;
  short sStack_bc2;
  short sStack_bc0;
  short sStack_bbe;
  short sStack_bbc;
  short sStack_bba;
  short local_ba8;
  short sStack_ba6;
  short sStack_ba4;
  short sStack_ba2;
  short sStack_ba0;
  short sStack_b9e;
  short sStack_b9c;
  short sStack_b9a;
  short local_b88;
  short sStack_b86;
  short sStack_b84;
  short sStack_b82;
  short sStack_b80;
  short sStack_b7e;
  short sStack_b7c;
  short sStack_b7a;
  short local_b68;
  short sStack_b66;
  short sStack_b64;
  short sStack_b62;
  short sStack_b60;
  short sStack_b5e;
  short sStack_b5c;
  short sStack_b5a;
  short local_b48;
  short sStack_b46;
  short sStack_b44;
  short sStack_b42;
  short sStack_b40;
  short sStack_b3e;
  short sStack_b3c;
  short sStack_b3a;
  short local_b28;
  short sStack_b26;
  short sStack_b24;
  short sStack_b22;
  short sStack_b20;
  short sStack_b1e;
  short sStack_b1c;
  short sStack_b1a;
  undefined2 local_a08;
  undefined2 uStack_a06;
  undefined2 uStack_a04;
  undefined2 uStack_a02;
  undefined2 local_9e8;
  undefined2 uStack_9e6;
  undefined2 uStack_9e4;
  undefined2 uStack_9e2;
  undefined2 local_9c8;
  undefined2 uStack_9c6;
  undefined2 uStack_9c4;
  undefined2 uStack_9c2;
  undefined2 local_9a8;
  undefined2 uStack_9a6;
  undefined2 uStack_9a4;
  undefined2 uStack_9a2;
  undefined2 local_988;
  undefined2 uStack_986;
  undefined2 uStack_984;
  undefined2 uStack_982;
  undefined2 local_968;
  undefined2 uStack_966;
  undefined2 uStack_964;
  undefined2 uStack_962;
  undefined2 local_948;
  undefined2 uStack_946;
  undefined2 uStack_944;
  undefined2 uStack_942;
  int iStack_894;
  int iStack_890;
  int iStack_88c;
  int iStack_874;
  int iStack_870;
  int iStack_86c;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  int iStack_834;
  int iStack_830;
  int iStack_82c;
  int iStack_814;
  int iStack_80c;
  int iStack_7f4;
  int iStack_7ec;
  int iStack_7d4;
  int iStack_7cc;
  int iStack_7b4;
  int iStack_7ac;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  int iStack_694;
  int iStack_68c;
  int iStack_674;
  int iStack_66c;
  int iStack_654;
  int iStack_64c;
  int iStack_634;
  int iStack_62c;
  int iStack_614;
  int iStack_60c;
  undefined2 uStack_5e0;
  undefined2 uStack_5de;
  undefined2 uStack_5dc;
  undefined2 uStack_5da;
  undefined2 uStack_5c0;
  undefined2 uStack_5be;
  undefined2 uStack_5bc;
  undefined2 uStack_5ba;
  undefined2 uStack_5a0;
  undefined2 uStack_59e;
  undefined2 uStack_59c;
  undefined2 uStack_59a;
  undefined2 uStack_580;
  undefined2 uStack_57e;
  undefined2 uStack_57c;
  undefined2 uStack_57a;
  undefined2 uStack_560;
  undefined2 uStack_55e;
  undefined2 uStack_55c;
  undefined2 uStack_55a;
  undefined2 uStack_540;
  undefined2 uStack_53e;
  undefined2 uStack_53c;
  undefined2 uStack_53a;
  int iStack_494;
  int iStack_48c;
  int iStack_474;
  int iStack_46c;
  int iStack_454;
  int iStack_44c;
  int iStack_434;
  int iStack_42c;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  
  if ((int)(uint)res_temp7_4x32b[0] % 4 != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x84,
                  "void ihevc_weighted_pred_uni_ssse3(WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if (dst1 % 4 != 0) {
    __assert_fail("(ht % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x85,
                  "void ihevc_weighted_pred_uni_ssse3(WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  iVar40 = 1 << (cStack0000000000000008 - 1U & 0x1f);
  auVar46._2_2_ = (short)dst3;
  auVar46._0_2_ = (short)dst3;
  auVar46._4_2_ = (short)dst3;
  auVar46._6_2_ = (short)dst3;
  auVar46._10_2_ = (short)dst3;
  auVar46._8_2_ = (short)dst3;
  auVar46._12_2_ = (short)dst3;
  auVar46._14_2_ = (short)dst3;
  uVar16 = CONCAT26(in_R8W,CONCAT24(in_R8W,CONCAT22(in_R8W,in_R8W)));
  uVar17 = CONCAT26(in_R8W,CONCAT24(in_R8W,CONCAT22(in_R8W,in_R8W)));
  auVar45._8_8_ = uVar17;
  auVar45._0_8_ = uVar16;
  auVar45 = pmulhw(auVar46,auVar45);
  local_948 = auVar45._0_2_;
  uStack_946 = auVar45._2_2_;
  uStack_944 = auVar45._4_2_;
  uStack_942 = auVar45._6_2_;
  iVar41 = CONCAT22(local_948,(short)dst3 * in_R8W);
  uStack_c70 = CONCAT22(uStack_944,(short)dst3 * in_R8W);
  _uStack_c70 = CONCAT26(uStack_942,CONCAT24((short)dst3 * in_R8W,uStack_c70));
  iStack_614 = (int)(CONCAT26(uStack_946,CONCAT24((short)dst3 * in_R8W,iVar41)) >> 0x20);
  iStack_60c = (int)((ulong)_uStack_c70 >> 0x20);
  iVar41 = iVar41 + iVar40;
  iStack_614 = iStack_614 + iVar40;
  uStack_c70 = uStack_c70 + iVar40;
  iStack_60c = iStack_60c + iVar40;
  local_bf0 = in_RSI;
  local_be8 = in_RDI;
  if (((uint)res_temp7_4x32b[0] & 7) == 0) {
    for (local_c04 = 0; local_c04 < dst1; local_c04 = local_c04 + 4) {
      for (local_c08 = 0; local_c08 < (int)(uint)res_temp7_4x32b[0]; local_c08 = local_c08 + 8) {
        uVar4 = *(undefined8 *)*local_be8;
        uVar5 = *(undefined8 *)(*local_be8 + 8);
        pauVar1 = (undefined1 (*) [16])(*local_be8 + (long)in_EDX * 2);
        uVar6 = *(undefined8 *)*pauVar1;
        uVar7 = *(undefined8 *)(*pauVar1 + 8);
        pauVar2 = (undefined1 (*) [16])(*local_be8 + (long)(in_EDX * 2) * 2);
        uVar18 = *(undefined8 *)*pauVar2;
        uVar19 = *(undefined8 *)(*pauVar2 + 8);
        pauVar3 = (undefined1 (*) [16])(*local_be8 + (long)(in_EDX * 3) * 2);
        uVar20 = *(undefined8 *)*pauVar3;
        uVar21 = *(undefined8 *)(*pauVar3 + 8);
        local_b28 = (short)uVar4;
        sStack_b26 = (short)((ulong)uVar4 >> 0x10);
        sStack_b24 = (short)((ulong)uVar4 >> 0x20);
        sStack_b22 = (short)((ulong)uVar4 >> 0x30);
        sStack_b20 = (short)uVar5;
        sStack_b1e = (short)((ulong)uVar5 >> 0x10);
        sStack_b1c = (short)((ulong)uVar5 >> 0x20);
        sStack_b1a = (short)((ulong)uVar5 >> 0x30);
        local_b48 = (short)uVar6;
        sStack_b46 = (short)((ulong)uVar6 >> 0x10);
        sStack_b44 = (short)((ulong)uVar6 >> 0x20);
        sStack_b42 = (short)((ulong)uVar6 >> 0x30);
        sStack_b40 = (short)uVar7;
        sStack_b3e = (short)((ulong)uVar7 >> 0x10);
        sStack_b3c = (short)((ulong)uVar7 >> 0x20);
        sStack_b3a = (short)((ulong)uVar7 >> 0x30);
        local_b68 = (short)uVar18;
        sStack_b66 = (short)((ulong)uVar18 >> 0x10);
        sStack_b64 = (short)((ulong)uVar18 >> 0x20);
        sStack_b62 = (short)((ulong)uVar18 >> 0x30);
        sStack_b60 = (short)uVar19;
        sStack_b5e = (short)((ulong)uVar19 >> 0x10);
        sStack_b5c = (short)((ulong)uVar19 >> 0x20);
        sStack_b5a = (short)((ulong)uVar19 >> 0x30);
        local_b88 = (short)uVar20;
        sStack_b86 = (short)((ulong)uVar20 >> 0x10);
        sStack_b84 = (short)((ulong)uVar20 >> 0x20);
        sStack_b82 = (short)((ulong)uVar20 >> 0x30);
        sStack_b80 = (short)uVar21;
        sStack_b7e = (short)((ulong)uVar21 >> 0x10);
        sStack_b7c = (short)((ulong)uVar21 >> 0x20);
        sStack_b7a = (short)((ulong)uVar21 >> 0x30);
        auVar26._8_8_ = uVar17;
        auVar26._0_8_ = uVar16;
        auVar45 = pmulhw(*local_be8,auVar26);
        auVar25._8_8_ = uVar17;
        auVar25._0_8_ = uVar16;
        auVar46 = pmulhw(*pauVar1,auVar25);
        auVar24._8_8_ = uVar17;
        auVar24._0_8_ = uVar16;
        auVar47 = pmulhw(*pauVar2,auVar24);
        auVar23._8_8_ = uVar17;
        auVar23._0_8_ = uVar16;
        auVar48 = pmulhw(*pauVar3,auVar23);
        uStack_540 = auVar45._8_2_;
        uStack_53e = auVar45._10_2_;
        uStack_53c = auVar45._12_2_;
        uStack_53a = auVar45._14_2_;
        uStack_560 = auVar46._8_2_;
        uStack_55e = auVar46._10_2_;
        uStack_55c = auVar46._12_2_;
        uStack_55a = auVar46._14_2_;
        uStack_580 = auVar47._8_2_;
        uStack_57e = auVar47._10_2_;
        uStack_57c = auVar47._12_2_;
        uStack_57a = auVar47._14_2_;
        uStack_5a0 = auVar48._8_2_;
        uStack_59e = auVar48._10_2_;
        uStack_59c = auVar48._12_2_;
        uStack_59a = auVar48._14_2_;
        local_968 = auVar45._0_2_;
        uStack_966 = auVar45._2_2_;
        uStack_964 = auVar45._4_2_;
        uStack_962 = auVar45._6_2_;
        local_ca8._0_4_ = CONCAT22(local_968,local_b28 * in_R8W);
        local_ca8._0_6_ = CONCAT24(sStack_b26 * in_R8W,(int)local_ca8);
        local_ca8 = CONCAT26(uStack_966,(undefined6)local_ca8);
        uStack_ca0._0_2_ = sStack_b24 * in_R8W;
        uStack_ca0._2_2_ = uStack_964;
        uStack_ca0._4_2_ = sStack_b22 * in_R8W;
        uStack_ca0._6_2_ = uStack_962;
        local_988 = auVar46._0_2_;
        uStack_986 = auVar46._2_2_;
        uStack_984 = auVar46._4_2_;
        uStack_982 = auVar46._6_2_;
        local_cb8._0_4_ = CONCAT22(local_988,local_b48 * in_R8W);
        local_cb8._0_6_ = CONCAT24(sStack_b46 * in_R8W,(int)local_cb8);
        local_cb8 = CONCAT26(uStack_986,(undefined6)local_cb8);
        uStack_cb0._0_2_ = sStack_b44 * in_R8W;
        uStack_cb0._2_2_ = uStack_984;
        uStack_cb0._4_2_ = sStack_b42 * in_R8W;
        uStack_cb0._6_2_ = uStack_982;
        local_9a8 = auVar47._0_2_;
        uStack_9a6 = auVar47._2_2_;
        uStack_9a4 = auVar47._4_2_;
        uStack_9a2 = auVar47._6_2_;
        local_cc8._0_4_ = CONCAT22(local_9a8,local_b68 * in_R8W);
        local_cc8._0_6_ = CONCAT24(sStack_b66 * in_R8W,(int)local_cc8);
        local_cc8 = CONCAT26(uStack_9a6,(undefined6)local_cc8);
        uStack_cc0._0_2_ = sStack_b64 * in_R8W;
        uStack_cc0._2_2_ = uStack_9a4;
        uStack_cc0._4_2_ = sStack_b62 * in_R8W;
        uStack_cc0._6_2_ = uStack_9a2;
        local_9c8 = auVar48._0_2_;
        uStack_9c6 = auVar48._2_2_;
        uStack_9c4 = auVar48._4_2_;
        uStack_9c2 = auVar48._6_2_;
        local_cd8._0_4_ = CONCAT22(local_9c8,local_b88 * in_R8W);
        local_cd8._0_6_ = CONCAT24(sStack_b86 * in_R8W,(int)local_cd8);
        local_cd8 = CONCAT26(uStack_9c6,(undefined6)local_cd8);
        uStack_cd0._0_2_ = sStack_b84 * in_R8W;
        uStack_cd0._2_2_ = uStack_9c4;
        uStack_cd0._4_2_ = sStack_b82 * in_R8W;
        uStack_cd0._6_2_ = uStack_9c2;
        iVar42 = CONCAT22(uStack_540,sStack_b20 * in_R8W);
        iVar49 = CONCAT22(uStack_53c,sStack_b1c * in_R8W);
        iStack_634 = (int)(CONCAT26(uStack_53e,CONCAT24(sStack_b1e * in_R8W,iVar42)) >> 0x20);
        iStack_62c = (int)(CONCAT26(uStack_53a,CONCAT24(sStack_b1a * in_R8W,iVar49)) >> 0x20);
        iVar42 = iVar42 + iVar41;
        iVar49 = iVar49 + uStack_c70;
        uStack_ce4 = (undefined2)(iStack_634 + iStack_614);
        uStack_ce2 = (undefined2)((uint)(iStack_634 + iStack_614) >> 0x10);
        uStack_cdc = (undefined2)(iStack_62c + iStack_60c);
        uStack_cda = (undefined2)((uint)(iStack_62c + iStack_60c) >> 0x10);
        iVar43 = CONCAT22(uStack_560,sStack_b40 * in_R8W);
        iVar50 = CONCAT22(uStack_55c,sStack_b3c * in_R8W);
        iStack_654 = (int)(CONCAT26(uStack_55e,CONCAT24(sStack_b3e * in_R8W,iVar43)) >> 0x20);
        iStack_64c = (int)(CONCAT26(uStack_55a,CONCAT24(sStack_b3a * in_R8W,iVar50)) >> 0x20);
        iVar43 = iVar43 + iVar41;
        iVar50 = iVar50 + uStack_c70;
        uStack_cf4 = (undefined2)(iStack_654 + iStack_614);
        uStack_cf2 = (undefined2)((uint)(iStack_654 + iStack_614) >> 0x10);
        uStack_cec = (undefined2)(iStack_64c + iStack_60c);
        uStack_cea = (undefined2)((uint)(iStack_64c + iStack_60c) >> 0x10);
        iVar44 = CONCAT22(uStack_580,sStack_b60 * in_R8W);
        iVar51 = CONCAT22(uStack_57c,sStack_b5c * in_R8W);
        iStack_674 = (int)(CONCAT26(uStack_57e,CONCAT24(sStack_b5e * in_R8W,iVar44)) >> 0x20);
        iStack_66c = (int)(CONCAT26(uStack_57a,CONCAT24(sStack_b5a * in_R8W,iVar51)) >> 0x20);
        iVar44 = iVar44 + iVar41;
        iVar51 = iVar51 + uStack_c70;
        uStack_d04 = (undefined2)(iStack_674 + iStack_614);
        uStack_d02 = (undefined2)((uint)(iStack_674 + iStack_614) >> 0x10);
        uStack_cfc = (undefined2)(iStack_66c + iStack_60c);
        uStack_cfa = (undefined2)((uint)(iStack_66c + iStack_60c) >> 0x10);
        iVar40 = CONCAT22(uStack_5a0,sStack_b80 * in_R8W);
        iVar52 = CONCAT22(uStack_59c,sStack_b7c * in_R8W);
        iStack_694 = (int)(CONCAT26(uStack_59e,CONCAT24(sStack_b7e * in_R8W,iVar40)) >> 0x20);
        iStack_68c = (int)(CONCAT26(uStack_59a,CONCAT24(sStack_b7a * in_R8W,iVar52)) >> 0x20);
        iVar40 = iVar40 + iVar41;
        iVar52 = iVar52 + uStack_c70;
        uStack_d14 = (undefined2)(iStack_694 + iStack_614);
        uStack_d12 = (undefined2)((uint)(iStack_694 + iStack_614) >> 0x10);
        uStack_d0c = (undefined2)(iStack_68c + iStack_60c);
        uStack_d0a = (undefined2)((uint)(iStack_68c + iStack_60c) >> 0x10);
        iStack_6b4 = (int)((ulong)local_ca8 >> 0x20);
        iStack_6b0 = local_ca8._8_4_;
        iStack_6ac = local_ca8._12_4_;
        iStack_6d4 = (int)((ulong)local_cb8 >> 0x20);
        iStack_6d0 = local_cb8._8_4_;
        iStack_6cc = local_cb8._12_4_;
        iStack_6f4 = (int)((ulong)local_cc8 >> 0x20);
        iStack_6f0 = local_cc8._8_4_;
        iStack_6ec = local_cc8._12_4_;
        iStack_714 = (int)((ulong)local_cd8 >> 0x20);
        iStack_710 = local_cd8._8_4_;
        iStack_70c = local_cd8._12_4_;
        auVar45 = ZEXT416(_cStack0000000000000008);
        auVar46 = ZEXT416(_cStack0000000000000008);
        auVar47 = ZEXT416(_cStack0000000000000008);
        auVar48 = ZEXT416(_cStack0000000000000008);
        iStack_434 = (int)(CONCAT26(uStack_ce2,CONCAT24(uStack_ce4,iVar42)) >> 0x20);
        iStack_42c = (int)(CONCAT26(uStack_cda,CONCAT24(uStack_cdc,iVar49)) >> 0x20);
        auVar53 = ZEXT416(_cStack0000000000000008);
        iVar42 = iVar42 >> auVar53;
        iVar49 = iVar49 >> auVar53;
        uStack_ce4 = (undefined2)(iStack_434 >> auVar53);
        uStack_ce2 = (undefined2)((uint)(iStack_434 >> auVar53) >> 0x10);
        uStack_cdc = (undefined2)(iStack_42c >> auVar53);
        uStack_cda = (undefined2)((uint)(iStack_42c >> auVar53) >> 0x10);
        iStack_454 = (int)(CONCAT26(uStack_cf2,CONCAT24(uStack_cf4,iVar43)) >> 0x20);
        iStack_44c = (int)(CONCAT26(uStack_cea,CONCAT24(uStack_cec,iVar50)) >> 0x20);
        auVar53 = ZEXT416(_cStack0000000000000008);
        iVar43 = iVar43 >> auVar53;
        iVar50 = iVar50 >> auVar53;
        uStack_cf4 = (undefined2)(iStack_454 >> auVar53);
        uStack_cf2 = (undefined2)((uint)(iStack_454 >> auVar53) >> 0x10);
        uStack_cec = (undefined2)(iStack_44c >> auVar53);
        uStack_cea = (undefined2)((uint)(iStack_44c >> auVar53) >> 0x10);
        iStack_474 = (int)(CONCAT26(uStack_d02,CONCAT24(uStack_d04,iVar44)) >> 0x20);
        iStack_46c = (int)(CONCAT26(uStack_cfa,CONCAT24(uStack_cfc,iVar51)) >> 0x20);
        auVar53 = ZEXT416(_cStack0000000000000008);
        iVar44 = iVar44 >> auVar53;
        iVar51 = iVar51 >> auVar53;
        uStack_d04 = (undefined2)(iStack_474 >> auVar53);
        uStack_d02 = (undefined2)((uint)(iStack_474 >> auVar53) >> 0x10);
        uStack_cfc = (undefined2)(iStack_46c >> auVar53);
        uStack_cfa = (undefined2)((uint)(iStack_46c >> auVar53) >> 0x10);
        iStack_494 = (int)(CONCAT26(uStack_d12,CONCAT24(uStack_d14,iVar40)) >> 0x20);
        iStack_48c = (int)(CONCAT26(uStack_d0a,CONCAT24(uStack_d0c,iVar52)) >> 0x20);
        auVar53 = ZEXT416(_cStack0000000000000008);
        iVar40 = iVar40 >> auVar53;
        iVar52 = iVar52 >> auVar53;
        uStack_d14 = (undefined2)(iStack_494 >> auVar53);
        uStack_d12 = (undefined2)((uint)(iStack_494 >> auVar53) >> 0x10);
        uStack_d0c = (undefined2)(iStack_48c >> auVar53);
        uStack_d0a = (undefined2)((uint)(iStack_48c >> auVar53) >> 0x10);
        local_ca8 = CONCAT44((iStack_6b4 + iStack_614 >> auVar45) + in_R9D,
                             ((int)local_ca8 + iVar41 >> auVar45) + in_R9D);
        uStack_ca0._0_4_ = (iStack_6b0 + uStack_c70 >> auVar45) + in_R9D;
        uStack_ca0._4_4_ = (iStack_6ac + iStack_60c >> auVar45) + in_R9D;
        local_cb8 = CONCAT44((iStack_6d4 + iStack_614 >> auVar46) + in_R9D,
                             ((int)local_cb8 + iVar41 >> auVar46) + in_R9D);
        uStack_cb0._0_4_ = (iStack_6d0 + uStack_c70 >> auVar46) + in_R9D;
        uStack_cb0._4_4_ = (iStack_6cc + iStack_60c >> auVar46) + in_R9D;
        local_cc8 = CONCAT44((iStack_6f4 + iStack_614 >> auVar47) + in_R9D,
                             ((int)local_cc8 + iVar41 >> auVar47) + in_R9D);
        uStack_cc0._0_4_ = (iStack_6f0 + uStack_c70 >> auVar47) + in_R9D;
        uStack_cc0._4_4_ = (iStack_6ec + iStack_60c >> auVar47) + in_R9D;
        local_cd8 = CONCAT44((iStack_714 + iStack_614 >> auVar48) + in_R9D,
                             ((int)local_cd8 + iVar41 >> auVar48) + in_R9D);
        uStack_cd0._0_4_ = (iStack_710 + uStack_c70 >> auVar48) + in_R9D;
        uStack_cd0._4_4_ = (iStack_70c + iStack_60c >> auVar48) + in_R9D;
        iStack_7b4 = (int)(CONCAT26(uStack_ce2,CONCAT24(uStack_ce4,iVar42)) >> 0x20);
        iStack_7ac = (int)(CONCAT26(uStack_cda,CONCAT24(uStack_cdc,iVar49)) >> 0x20);
        uStack_ce4 = (undefined2)(iStack_7b4 + in_R9D);
        uStack_ce2 = (undefined2)((uint)(iStack_7b4 + in_R9D) >> 0x10);
        uStack_cdc = (undefined2)(iStack_7ac + in_R9D);
        uStack_cda = (undefined2)((uint)(iStack_7ac + in_R9D) >> 0x10);
        iStack_7d4 = (int)(CONCAT26(uStack_cf2,CONCAT24(uStack_cf4,iVar43)) >> 0x20);
        iStack_7cc = (int)(CONCAT26(uStack_cea,CONCAT24(uStack_cec,iVar50)) >> 0x20);
        uStack_cf4 = (undefined2)(iStack_7d4 + in_R9D);
        uStack_cf2 = (undefined2)((uint)(iStack_7d4 + in_R9D) >> 0x10);
        uStack_cec = (undefined2)(iStack_7cc + in_R9D);
        uStack_cea = (undefined2)((uint)(iStack_7cc + in_R9D) >> 0x10);
        iStack_7f4 = (int)(CONCAT26(uStack_d02,CONCAT24(uStack_d04,iVar44)) >> 0x20);
        iStack_7ec = (int)(CONCAT26(uStack_cfa,CONCAT24(uStack_cfc,iVar51)) >> 0x20);
        uStack_d04 = (undefined2)(iStack_7f4 + in_R9D);
        uStack_d02 = (undefined2)((uint)(iStack_7f4 + in_R9D) >> 0x10);
        uStack_cfc = (undefined2)(iStack_7ec + in_R9D);
        uStack_cfa = (undefined2)((uint)(iStack_7ec + in_R9D) >> 0x10);
        iStack_814 = (int)(CONCAT26(uStack_d12,CONCAT24(uStack_d14,iVar40)) >> 0x20);
        iStack_80c = (int)(CONCAT26(uStack_d0a,CONCAT24(uStack_d0c,iVar52)) >> 0x20);
        uStack_d14 = (undefined2)(iStack_814 + in_R9D);
        uStack_d12 = (undefined2)((uint)(iStack_814 + in_R9D) >> 0x10);
        uStack_d0c = (undefined2)(iStack_80c + in_R9D);
        uStack_d0a = (undefined2)((uint)(iStack_80c + in_R9D) >> 0x10);
        auVar37._4_2_ = uStack_ce4;
        auVar37._0_4_ = iVar42 + in_R9D;
        auVar37._6_2_ = uStack_ce2;
        auVar37._12_2_ = uStack_cdc;
        auVar37._8_4_ = iVar49 + in_R9D;
        auVar37._14_2_ = uStack_cda;
        auVar38._8_8_ = uStack_ca0;
        auVar38._0_8_ = local_ca8;
        auVar45 = packssdw(auVar38,auVar37);
        auVar35._4_2_ = uStack_cf4;
        auVar35._0_4_ = iVar43 + in_R9D;
        auVar35._6_2_ = uStack_cf2;
        auVar35._12_2_ = uStack_cec;
        auVar35._8_4_ = iVar50 + in_R9D;
        auVar35._14_2_ = uStack_cea;
        auVar36._8_8_ = uStack_cb0;
        auVar36._0_8_ = local_cb8;
        auVar46 = packssdw(auVar36,auVar35);
        auVar33._4_2_ = uStack_d04;
        auVar33._0_4_ = iVar44 + in_R9D;
        auVar33._6_2_ = uStack_d02;
        auVar33._12_2_ = uStack_cfc;
        auVar33._8_4_ = iVar51 + in_R9D;
        auVar33._14_2_ = uStack_cfa;
        auVar34._8_8_ = uStack_cc0;
        auVar34._0_8_ = local_cc8;
        auVar47 = packssdw(auVar34,auVar33);
        auVar31._4_2_ = uStack_d14;
        auVar31._0_4_ = iVar40 + in_R9D;
        auVar31._6_2_ = uStack_d12;
        auVar31._12_2_ = uStack_d0c;
        auVar31._8_4_ = iVar52 + in_R9D;
        auVar31._14_2_ = uStack_d0a;
        auVar32._8_8_ = uStack_cd0;
        auVar32._0_8_ = local_cd8;
        auVar48 = packssdw(auVar32,auVar31);
        local_258 = auVar45._0_2_;
        sStack_256 = auVar45._2_2_;
        sStack_254 = auVar45._4_2_;
        sStack_252 = auVar45._6_2_;
        sStack_250 = auVar45._8_2_;
        sStack_24e = auVar45._10_2_;
        sStack_24c = auVar45._12_2_;
        sStack_24a = auVar45._14_2_;
        local_ca8._0_2_ =
             CONCAT11((0 < sStack_256) * (sStack_256 < 0x100) * auVar45[2] - (0xff < sStack_256),
                      (0 < local_258) * (local_258 < 0x100) * auVar45[0] - (0xff < local_258));
        local_ca8._0_3_ =
             CONCAT12((0 < sStack_254) * (sStack_254 < 0x100) * auVar45[4] - (0xff < sStack_254),
                      (undefined2)local_ca8);
        local_ca8._0_4_ =
             CONCAT13((0 < sStack_252) * (sStack_252 < 0x100) * auVar45[6] - (0xff < sStack_252),
                      (undefined3)local_ca8);
        local_ca8._0_5_ =
             CONCAT14((0 < sStack_250) * (sStack_250 < 0x100) * auVar45[8] - (0xff < sStack_250),
                      (int)local_ca8);
        local_ca8._0_6_ =
             CONCAT15((0 < sStack_24e) * (sStack_24e < 0x100) * auVar45[10] - (0xff < sStack_24e),
                      (undefined5)local_ca8);
        local_ca8._0_7_ =
             CONCAT16((0 < sStack_24c) * (sStack_24c < 0x100) * auVar45[0xc] - (0xff < sStack_24c),
                      (undefined6)local_ca8);
        local_ca8 = CONCAT17((0 < sStack_24a) * (sStack_24a < 0x100) * auVar45[0xe] -
                             (0xff < sStack_24a),(undefined7)local_ca8);
        local_278 = auVar46._0_2_;
        sStack_276 = auVar46._2_2_;
        sStack_274 = auVar46._4_2_;
        sStack_272 = auVar46._6_2_;
        sStack_270 = auVar46._8_2_;
        sStack_26e = auVar46._10_2_;
        sStack_26c = auVar46._12_2_;
        sStack_26a = auVar46._14_2_;
        local_cb8._0_4_ =
             CONCAT13((0 < sStack_272) * (sStack_272 < 0x100) * auVar46[6] - (0xff < sStack_272),
                      CONCAT12((0 < sStack_274) * (sStack_274 < 0x100) * auVar46[4] -
                               (0xff < sStack_274),
                               CONCAT11((0 < sStack_276) * (sStack_276 < 0x100) * auVar46[2] -
                                        (0xff < sStack_276),
                                        (0 < local_278) * (local_278 < 0x100) * auVar46[0] -
                                        (0xff < local_278))));
        local_cb8._0_6_ =
             CONCAT15((0 < sStack_26e) * (sStack_26e < 0x100) * auVar46[10] - (0xff < sStack_26e),
                      CONCAT14((0 < sStack_270) * (sStack_270 < 0x100) * auVar46[8] -
                               (0xff < sStack_270),(int)local_cb8));
        local_cb8 = CONCAT17((0 < sStack_26a) * (sStack_26a < 0x100) * auVar46[0xe] -
                             (0xff < sStack_26a),
                             CONCAT16((0 < sStack_26c) * (sStack_26c < 0x100) * auVar46[0xc] -
                                      (0xff < sStack_26c),(undefined6)local_cb8));
        local_298 = auVar47._0_2_;
        sStack_296 = auVar47._2_2_;
        sStack_294 = auVar47._4_2_;
        sStack_292 = auVar47._6_2_;
        sStack_290 = auVar47._8_2_;
        sStack_28e = auVar47._10_2_;
        sStack_28c = auVar47._12_2_;
        sStack_28a = auVar47._14_2_;
        local_cc8._0_4_ =
             CONCAT13((0 < sStack_292) * (sStack_292 < 0x100) * auVar47[6] - (0xff < sStack_292),
                      CONCAT12((0 < sStack_294) * (sStack_294 < 0x100) * auVar47[4] -
                               (0xff < sStack_294),
                               CONCAT11((0 < sStack_296) * (sStack_296 < 0x100) * auVar47[2] -
                                        (0xff < sStack_296),
                                        (0 < local_298) * (local_298 < 0x100) * auVar47[0] -
                                        (0xff < local_298))));
        local_cc8._0_6_ =
             CONCAT15((0 < sStack_28e) * (sStack_28e < 0x100) * auVar47[10] - (0xff < sStack_28e),
                      CONCAT14((0 < sStack_290) * (sStack_290 < 0x100) * auVar47[8] -
                               (0xff < sStack_290),(int)local_cc8));
        local_cc8 = CONCAT17((0 < sStack_28a) * (sStack_28a < 0x100) * auVar47[0xe] -
                             (0xff < sStack_28a),
                             CONCAT16((0 < sStack_28c) * (sStack_28c < 0x100) * auVar47[0xc] -
                                      (0xff < sStack_28c),(undefined6)local_cc8));
        local_2b8 = auVar48._0_2_;
        sStack_2b6 = auVar48._2_2_;
        sStack_2b4 = auVar48._4_2_;
        sStack_2b2 = auVar48._6_2_;
        sStack_2b0 = auVar48._8_2_;
        sStack_2ae = auVar48._10_2_;
        sStack_2ac = auVar48._12_2_;
        sStack_2aa = auVar48._14_2_;
        local_cd8._0_4_ =
             CONCAT13((0 < sStack_2b2) * (sStack_2b2 < 0x100) * auVar48[6] - (0xff < sStack_2b2),
                      CONCAT12((0 < sStack_2b4) * (sStack_2b4 < 0x100) * auVar48[4] -
                               (0xff < sStack_2b4),
                               CONCAT11((0 < sStack_2b6) * (sStack_2b6 < 0x100) * auVar48[2] -
                                        (0xff < sStack_2b6),
                                        (0 < local_2b8) * (local_2b8 < 0x100) * auVar48[0] -
                                        (0xff < local_2b8))));
        local_cd8._0_6_ =
             CONCAT15((0 < sStack_2ae) * (sStack_2ae < 0x100) * auVar48[10] - (0xff < sStack_2ae),
                      CONCAT14((0 < sStack_2b0) * (sStack_2b0 < 0x100) * auVar48[8] -
                               (0xff < sStack_2b0),(int)local_cd8));
        local_cd8 = CONCAT17((0 < sStack_2aa) * (sStack_2aa < 0x100) * auVar48[0xe] -
                             (0xff < sStack_2aa),
                             CONCAT16((0 < sStack_2ac) * (sStack_2ac < 0x100) * auVar48[0xc] -
                                      (0xff < sStack_2ac),(undefined6)local_cd8));
        *local_bf0 = local_ca8;
        *(undefined8 *)((long)local_bf0 + (long)in_ECX) = local_cb8;
        *(undefined8 *)((long)local_bf0 + (long)(in_ECX * 2)) = local_cc8;
        *(undefined8 *)((long)local_bf0 + (long)(in_ECX * 3)) = local_cd8;
        local_be8 = local_be8 + 1;
        local_bf0 = local_bf0 + 1;
      }
      local_be8 = (undefined1 (*) [16])
                  ((long)local_be8 +
                  (long)(in_EDX << 2) * 2 + (long)(int)(uint)res_temp7_4x32b[0] * -2);
      local_bf0 = (undefined8 *)
                  ((long)local_bf0 + ((long)(in_ECX << 2) - (long)(int)(uint)res_temp7_4x32b[0]));
    }
  }
  else {
    for (local_c04 = 0; local_c04 < dst1; local_c04 = local_c04 + 4) {
      for (local_c08 = 0; local_c08 < (int)(uint)res_temp7_4x32b[0]; local_c08 = local_c08 + 4) {
        uVar4 = *(undefined8 *)*local_be8;
        uVar5 = *(undefined8 *)(*local_be8 + (long)in_EDX * 2);
        uVar6 = *(undefined8 *)(*local_be8 + (long)(in_EDX * 2) * 2);
        uVar7 = *(undefined8 *)(*local_be8 + (long)(in_EDX * 3) * 2);
        local_ba8 = (short)uVar4;
        sStack_ba6 = (short)((ulong)uVar4 >> 0x10);
        sStack_ba4 = (short)((ulong)uVar4 >> 0x20);
        sStack_ba2 = (short)((ulong)uVar4 >> 0x30);
        sStack_ba0 = (short)uVar6;
        sStack_b9e = (short)((ulong)uVar6 >> 0x10);
        sStack_b9c = (short)((ulong)uVar6 >> 0x20);
        sStack_b9a = (short)((ulong)uVar6 >> 0x30);
        local_bc8 = (short)uVar5;
        sStack_bc6 = (short)((ulong)uVar5 >> 0x10);
        sStack_bc4 = (short)((ulong)uVar5 >> 0x20);
        sStack_bc2 = (short)((ulong)uVar5 >> 0x30);
        sStack_bc0 = (short)uVar7;
        sStack_bbe = (short)((ulong)uVar7 >> 0x10);
        sStack_bbc = (short)((ulong)uVar7 >> 0x20);
        sStack_bba = (short)((ulong)uVar7 >> 0x30);
        auVar22._8_8_ = uVar6;
        auVar22._0_8_ = uVar4;
        auVar53._8_8_ = uVar17;
        auVar53._0_8_ = uVar16;
        auVar45 = pmulhw(auVar22,auVar53);
        auVar48._8_8_ = uVar7;
        auVar48._0_8_ = uVar5;
        auVar47._8_8_ = uVar17;
        auVar47._0_8_ = uVar16;
        auVar46 = pmulhw(auVar48,auVar47);
        uStack_5c0 = auVar45._8_2_;
        uStack_5be = auVar45._10_2_;
        uStack_5bc = auVar45._12_2_;
        uStack_5ba = auVar45._14_2_;
        local_cc8._0_4_ = CONCAT22(uStack_5c0,sStack_ba0 * in_R8W);
        local_cc8._0_6_ = CONCAT24(sStack_b9e * in_R8W,(int)local_cc8);
        local_cc8 = CONCAT26(uStack_5be,(undefined6)local_cc8);
        uStack_cc0._0_2_ = sStack_b9c * in_R8W;
        uStack_cc0._2_2_ = uStack_5bc;
        uStack_cc0._4_2_ = sStack_b9a * in_R8W;
        uStack_cc0._6_2_ = uStack_5ba;
        uStack_5e0 = auVar46._8_2_;
        uStack_5de = auVar46._10_2_;
        uStack_5dc = auVar46._12_2_;
        uStack_5da = auVar46._14_2_;
        local_cd8._0_4_ = CONCAT22(uStack_5e0,sStack_bc0 * in_R8W);
        local_cd8._0_6_ = CONCAT24(sStack_bbe * in_R8W,(int)local_cd8);
        local_cd8 = CONCAT26(uStack_5de,(undefined6)local_cd8);
        uStack_cd0._0_2_ = sStack_bbc * in_R8W;
        uStack_cd0._2_2_ = uStack_5dc;
        uStack_cd0._4_2_ = sStack_bba * in_R8W;
        uStack_cd0._6_2_ = uStack_5da;
        local_9e8 = auVar45._0_2_;
        uStack_9e6 = auVar45._2_2_;
        uStack_9e4 = auVar45._4_2_;
        uStack_9e2 = auVar45._6_2_;
        local_ca8._0_4_ = CONCAT22(local_9e8,local_ba8 * in_R8W);
        local_ca8._0_6_ = CONCAT24(sStack_ba6 * in_R8W,(int)local_ca8);
        local_ca8 = CONCAT26(uStack_9e6,(undefined6)local_ca8);
        uStack_ca0._0_2_ = sStack_ba4 * in_R8W;
        uStack_ca0._2_2_ = uStack_9e4;
        uStack_ca0._4_2_ = sStack_ba2 * in_R8W;
        uStack_ca0._6_2_ = uStack_9e2;
        local_a08 = auVar46._0_2_;
        uStack_a06 = auVar46._2_2_;
        uStack_a04 = auVar46._4_2_;
        uStack_a02 = auVar46._6_2_;
        local_cb8._0_4_ = CONCAT22(local_a08,local_bc8 * in_R8W);
        local_cb8._0_6_ = CONCAT24(sStack_bc6 * in_R8W,(int)local_cb8);
        local_cb8 = CONCAT26(uStack_a06,(undefined6)local_cb8);
        uStack_cb0._0_2_ = sStack_bc4 * in_R8W;
        uStack_cb0._2_2_ = uStack_a04;
        uStack_cb0._4_2_ = sStack_bc2 * in_R8W;
        uStack_cb0._6_2_ = uStack_a02;
        iStack_834 = (int)((ulong)local_cc8 >> 0x20);
        iStack_830 = local_cc8._8_4_;
        iStack_82c = local_cc8._12_4_;
        iStack_854 = (int)((ulong)local_cd8 >> 0x20);
        iStack_850 = local_cd8._8_4_;
        iStack_84c = local_cd8._12_4_;
        iStack_874 = (int)((ulong)local_ca8 >> 0x20);
        iStack_870 = local_ca8._8_4_;
        iStack_86c = local_ca8._12_4_;
        iStack_894 = (int)((ulong)local_cb8 >> 0x20);
        iStack_890 = local_cb8._8_4_;
        iStack_88c = local_cb8._12_4_;
        auVar45 = ZEXT416(_cStack0000000000000008);
        auVar46 = ZEXT416(_cStack0000000000000008);
        auVar47 = ZEXT416(_cStack0000000000000008);
        auVar48 = ZEXT416(_cStack0000000000000008);
        local_ca8 = CONCAT44((iStack_874 + iStack_614 >> auVar45) + in_R9D,
                             ((int)local_ca8 + iVar41 >> auVar45) + in_R9D);
        uStack_ca0._0_4_ = (iStack_870 + uStack_c70 >> auVar45) + in_R9D;
        uStack_ca0._4_4_ = (iStack_86c + iStack_60c >> auVar45) + in_R9D;
        local_cb8 = CONCAT44((iStack_894 + iStack_614 >> auVar46) + in_R9D,
                             ((int)local_cb8 + iVar41 >> auVar46) + in_R9D);
        uStack_cb0._0_4_ = (iStack_890 + uStack_c70 >> auVar46) + in_R9D;
        uStack_cb0._4_4_ = (iStack_88c + iStack_60c >> auVar46) + in_R9D;
        local_cc8 = CONCAT44((iStack_834 + iStack_614 >> auVar47) + in_R9D,
                             ((int)local_cc8 + iVar41 >> auVar47) + in_R9D);
        uStack_cc0._0_4_ = (iStack_830 + uStack_c70 >> auVar47) + in_R9D;
        uStack_cc0._4_4_ = (iStack_82c + iStack_60c >> auVar47) + in_R9D;
        local_cd8 = CONCAT44((iStack_854 + iStack_614 >> auVar48) + in_R9D,
                             ((int)local_cd8 + iVar41 >> auVar48) + in_R9D);
        uStack_cd0._0_4_ = (iStack_850 + uStack_c70 >> auVar48) + in_R9D;
        uStack_cd0._4_4_ = (iStack_84c + iStack_60c >> auVar48) + in_R9D;
        auVar30._8_8_ = uStack_ca0;
        auVar30._0_8_ = local_ca8;
        auVar29._8_8_ = uStack_cb0;
        auVar29._0_8_ = local_cb8;
        auVar45 = packssdw(auVar30,auVar29);
        auVar28._8_8_ = uStack_cc0;
        auVar28._0_8_ = local_cc8;
        auVar27._8_8_ = uStack_cd0;
        auVar27._0_8_ = local_cd8;
        auVar46 = packssdw(auVar28,auVar27);
        local_2d8 = auVar45._0_2_;
        sStack_2d6 = auVar45._2_2_;
        sStack_2d4 = auVar45._4_2_;
        sStack_2d2 = auVar45._6_2_;
        sStack_2d0 = auVar45._8_2_;
        sStack_2ce = auVar45._10_2_;
        sStack_2cc = auVar45._12_2_;
        sStack_2ca = auVar45._14_2_;
        sVar8 = auVar46._0_2_;
        sVar9 = auVar46._2_2_;
        sVar10 = auVar46._4_2_;
        sVar11 = auVar46._6_2_;
        sVar12 = auVar46._8_2_;
        sVar13 = auVar46._10_2_;
        sVar14 = auVar46._12_2_;
        sVar15 = auVar46._14_2_;
        local_ca8._0_2_ =
             CONCAT11((0 < sStack_2d6) * (sStack_2d6 < 0x100) * auVar45[2] - (0xff < sStack_2d6),
                      (0 < local_2d8) * (local_2d8 < 0x100) * auVar45[0] - (0xff < local_2d8));
        local_ca8._0_3_ =
             CONCAT12((0 < sStack_2d4) * (sStack_2d4 < 0x100) * auVar45[4] - (0xff < sStack_2d4),
                      (undefined2)local_ca8);
        local_ca8._0_4_ =
             CONCAT13((0 < sStack_2d2) * (sStack_2d2 < 0x100) * auVar45[6] - (0xff < sStack_2d2),
                      (undefined3)local_ca8);
        local_ca8._0_5_ =
             CONCAT14((0 < sStack_2d0) * (sStack_2d0 < 0x100) * auVar45[8] - (0xff < sStack_2d0),
                      (int)local_ca8);
        local_ca8._0_6_ =
             CONCAT15((0 < sStack_2ce) * (sStack_2ce < 0x100) * auVar45[10] - (0xff < sStack_2ce),
                      (undefined5)local_ca8);
        local_ca8._0_7_ =
             CONCAT16((0 < sStack_2cc) * (sStack_2cc < 0x100) * auVar45[0xc] - (0xff < sStack_2cc),
                      (undefined6)local_ca8);
        local_ca8 = CONCAT17((0 < sStack_2ca) * (sStack_2ca < 0x100) * auVar45[0xe] -
                             (0xff < sStack_2ca),(undefined7)local_ca8);
        uStack_ca0._0_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar46[0] - (0xff < sVar8);
        uStack_ca0._1_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar46[2] - (0xff < sVar9);
        uStack_ca0._2_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar46[4] - (0xff < sVar10);
        uStack_ca0._3_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar46[6] - (0xff < sVar11);
        auVar39 = _local_ca8;
        uStack_ca0._4_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar46[8] - (0xff < sVar12);
        uStack_ca0._5_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar46[10] - (0xff < sVar13);
        uStack_ca0._6_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar46[0xc] - (0xff < sVar14);
        uStack_ca0._7_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar46[0xe] - (0xff < sVar15);
        auVar45 = _local_ca8;
        uStack_ca0._0_4_ = auVar39._8_4_;
        uStack_ca0._4_4_ = auVar45._12_4_;
        *(int *)local_bf0 = (int)local_ca8;
        *(undefined4 *)((long)local_bf0 + (long)in_ECX) = local_ca8._4_4_;
        *(undefined4 *)((long)local_bf0 + (long)(in_ECX << 1)) = (undefined4)uStack_ca0;
        *(undefined4 *)((long)local_bf0 + (long)(in_ECX * 3)) = uStack_ca0._4_4_;
        local_be8 = (undefined1 (*) [16])(*local_be8 + 8);
        local_bf0 = (undefined8 *)((long)local_bf0 + 4);
      }
      local_be8 = (undefined1 (*) [16])
                  ((long)local_be8 +
                  (long)(in_EDX << 2) * 2 + (long)(int)(uint)res_temp7_4x32b[0] * -2);
      local_bf0 = (undefined8 *)
                  ((long)local_bf0 + ((long)(in_ECX << 2) - (long)(int)(uint)res_temp7_4x32b[0]));
    }
  }
  return;
}

Assistant:

void ihevc_weighted_pred_uni_ssse3(WORD16 *pi2_src,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd,
                                   WORD32 dst_strd,
                                   WORD32 wgt0,
                                   WORD32 off0,
                                   WORD32 shift,
                                   WORD32 lvl_shift,
                                   WORD32 ht,
                                   WORD32 wd)
{
    WORD32 row, col, temp;

    /* all 128 bit registers are named with a suffix mxnb, where m is the */
    /* number of n bits packed in the register                            */
    __m128i src_temp0_8x16b, src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b;
    __m128i const_temp_4x32b, lvl_shift_4x32b, wgt0_8x16b, off0_4x32b;
    __m128i res_temp0_4x32b, res_temp1_4x32b, res_temp2_4x32b, res_temp3_4x32b;

    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

    temp = 1 << (shift - 1);

    // seting values in register
    lvl_shift_4x32b = _mm_set1_epi16(lvl_shift);
    wgt0_8x16b = _mm_set1_epi16(wgt0);

    /* lvl_shift * wgt0 */
    res_temp0_4x32b = _mm_mullo_epi16(lvl_shift_4x32b, wgt0_8x16b);
    res_temp1_4x32b = _mm_mulhi_epi16(lvl_shift_4x32b, wgt0_8x16b);

    const_temp_4x32b = _mm_set1_epi32(temp);
    off0_4x32b = _mm_set1_epi32(off0);


    /* lvl_shift * wgt0 */
    lvl_shift_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, res_temp1_4x32b);
    /* lvl_shift * wgt0 + 1 << (shift - 1) */
    lvl_shift_4x32b = _mm_add_epi32(lvl_shift_4x32b, const_temp_4x32b);

    if(0 == (wd & 7)) /* wd multiple of 8 case */
    {
        __m128i res_temp4_4x32b, res_temp5_4x32b, res_temp6_4x32b, res_temp7_4x32b;

        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 8)
            {   /* for row =0 ,1,2,3*/

                /* row = 0 */ /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp0_8x16b = _mm_loadu_si128((__m128i *)(pi2_src));
                /* row = 1 */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + src_strd));
                /* row = 2 */
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + 2 * src_strd));
                /* row = 3 */
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src + 3 * src_strd));

                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Lower 16 bit */
                res_temp0_4x32b  = _mm_mullo_epi16(src_temp0_8x16b, wgt0_8x16b);
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt0_8x16b);
                res_temp3_4x32b  = _mm_mullo_epi16(src_temp3_8x16b, wgt0_8x16b);

                /*i4_tmp = (pi2_src[col] ) * wgt0*/ /* Higher 16 bit */
                src_temp0_8x16b  = _mm_mulhi_epi16(src_temp0_8x16b, wgt0_8x16b);
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt0_8x16b);
                src_temp3_8x16b  = _mm_mulhi_epi16(src_temp3_8x16b, wgt0_8x16b);

                /* Get 32 bit Result */
                res_temp4_4x32b = _mm_unpackhi_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp5_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp6_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp7_4x32b = _mm_unpackhi_epi16(res_temp3_4x32b, src_temp3_8x16b);

                res_temp0_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp3_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, src_temp3_8x16b);

                /* i4_tmp = (pi2_src[col] + lvl_shift) * wgt0 + 1 << (shift - 1) */
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, lvl_shift_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, lvl_shift_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, lvl_shift_4x32b);
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, lvl_shift_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift_4x32b);

                /* (i4_tmp >> shift) */ /* First 4 pixels */
                res_temp0_4x32b = _mm_srai_epi32(res_temp0_4x32b, shift);
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b, shift);
                res_temp2_4x32b = _mm_srai_epi32(res_temp2_4x32b, shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b, shift);

                /* (i4_tmp >> shift) */ /* Last 4 pixels */
                res_temp4_4x32b = _mm_srai_epi32(res_temp4_4x32b, shift);
                res_temp5_4x32b = _mm_srai_epi32(res_temp5_4x32b, shift);
                res_temp6_4x32b = _mm_srai_epi32(res_temp6_4x32b, shift);
                res_temp7_4x32b = _mm_srai_epi32(res_temp7_4x32b, shift);

                /*i4_tmp = (i4_tmp >> shift) + off0; */ /* First 4 pixels */
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, off0_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, off0_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, off0_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, off0_4x32b);

                /*i4_tmp = (i4_tmp >> shift) + off0; */ /* Last 4 pixels */
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, off0_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, off0_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, off0_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, off0_4x32b);

                res_temp0_4x32b = _mm_packs_epi32(res_temp0_4x32b, res_temp4_4x32b);
                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp5_4x32b);
                res_temp2_4x32b = _mm_packs_epi32(res_temp2_4x32b, res_temp6_4x32b);
                res_temp3_4x32b = _mm_packs_epi32(res_temp3_4x32b, res_temp7_4x32b);
                /* pu1_dst[col] = CLIP_U8(i4_tmp); */
                res_temp0_4x32b = _mm_packus_epi16(res_temp0_4x32b, res_temp0_4x32b);
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);
                res_temp2_4x32b = _mm_packus_epi16(res_temp2_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_packus_epi16(res_temp3_4x32b, res_temp3_4x32b);

                /* store four 8-bit output values  */
                _mm_storel_epi64((__m128i *)(pu1_dst + 0 * dst_strd), res_temp0_4x32b); /* row = 0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), res_temp1_4x32b); /* row = 2*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 2 * dst_strd), res_temp2_4x32b); /* row = 1*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 3 * dst_strd), res_temp3_4x32b); /* row = 3*/

                /* To update pointer */
                pi2_src += 8;
                pu1_dst += 8;

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src = pi2_src - wd + 4 * src_strd;    /* Pointer update */
            pu1_dst = pu1_dst - wd + 4 * dst_strd; /* Pointer update */

        }
    }
    else  /* wd multiple of 4 case */
    {
        WORD32 dst0, dst1, dst2, dst3;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 4)
            {   /* for row =0 ,1,2,3*/

                /* row = 0 */ /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp0_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src));
                /* row = 1 */
                src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + src_strd));
                /* row = 2 */
                src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + 2 * src_strd));
                /* row = 3 */
                src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + 3 * src_strd));

                /* 2 rows together */
                src_temp0_8x16b = _mm_unpacklo_epi64(src_temp0_8x16b, src_temp2_8x16b);
                src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);

                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Lower 16 bit */
                res_temp0_4x32b  = _mm_mullo_epi16(src_temp0_8x16b, wgt0_8x16b);
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                /*i4_tmp = (pi2_src[col]) * wgt0*/ /* Higher 16 bit */
                src_temp0_8x16b  = _mm_mulhi_epi16(src_temp0_8x16b, wgt0_8x16b);
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);

                /* Get 32 bit Result */
                res_temp2_4x32b = _mm_unpackhi_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp3_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);

                res_temp0_4x32b = _mm_unpacklo_epi16(res_temp0_4x32b, src_temp0_8x16b);
                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);

                /* i4_tmp = (pi2_src[col] + lvl_shift) * wgt0 + 1 << (shift - 1) */
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift_4x32b);
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, lvl_shift_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift_4x32b);

                /* (i4_tmp >> shift) */
                res_temp0_4x32b = _mm_srai_epi32(res_temp0_4x32b, shift);
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b, shift);
                res_temp2_4x32b = _mm_srai_epi32(res_temp2_4x32b, shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b, shift);

                /*i4_tmp = (i4_tmp >> shift) + off0; */
                res_temp0_4x32b = _mm_add_epi32(res_temp0_4x32b, off0_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, off0_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, off0_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, off0_4x32b);

                res_temp0_4x32b = _mm_packs_epi32(res_temp0_4x32b, res_temp1_4x32b);
                res_temp2_4x32b = _mm_packs_epi32(res_temp2_4x32b, res_temp3_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp); */
                res_temp0_4x32b = _mm_packus_epi16(res_temp0_4x32b, res_temp2_4x32b);

                dst0 = _mm_cvtsi128_si32(res_temp0_4x32b);
                /* dst row = 1 to 3 */
                res_temp1_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 1);
                res_temp2_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 2);
                res_temp3_4x32b = _mm_shuffle_epi32(res_temp0_4x32b, 3);

                /* store four 8-bit output values  */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                dst1 = _mm_cvtsi128_si32(res_temp1_4x32b);
                dst2 = _mm_cvtsi128_si32(res_temp2_4x32b);
                dst3 = _mm_cvtsi128_si32(res_temp3_4x32b);

                /* row = 1 to row = 3 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;
                *(WORD32 *)(&pu1_dst[2 * dst_strd]) = dst2;
                *(WORD32 *)(&pu1_dst[3 * dst_strd]) = dst3;

                /* To update pointer */
                pi2_src += 4;
                pu1_dst += 4;

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src = pi2_src - wd + 4 * src_strd;    /* Pointer update */
            pu1_dst = pu1_dst - wd + 4 * dst_strd; /* Pointer update */

        }
    }
}